

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O3

void (anonymous_namespace)::check<Imf_3_4::InputFile,Imf_3_4::OutputFile>
               (char *filename,string *inputtype,string *outputtype,bool add_tiledesc)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined4 *puVar4;
  undefined8 *puVar5;
  ostream *poVar6;
  void *pvVar7;
  size_t sVar8;
  OutputFile file;
  Header f;
  long *local_a0;
  long local_98;
  long local_90 [2];
  undefined8 local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  Header local_60 [56];
  
  local_80 = 0;
  Imf_3_4::Header::Header(local_60,0x40,0x40,1.0,(Vec2 *)&local_80,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  pcVar3 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&local_80,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar3,(Channel *)"Dummy");
  sVar8 = *(size_t *)(filename + 8);
  if (sVar8 == DAT_001eafb0) {
    if (sVar8 != 0) {
      iVar2 = bcmp(*(void **)filename,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
      if (iVar2 != 0) goto LAB_001306e7;
    }
  }
  else {
LAB_001306e7:
    Imf_3_4::Header::setType((string *)local_60);
  }
  puVar4 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar4 = 2;
  remove("/var/tmp/badfile.exr");
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile((OutputFile *)&local_80,"/var/tmp/badfile.exr",local_60,iVar2);
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)&local_80);
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)&local_80,"/var/tmp/badfile.exr",iVar2,true);
  sVar8 = inputtype->_M_string_length;
  if (sVar8 == DAT_001eafb0) {
    if (sVar8 == 0) {
LAB_0013088b:
      sVar8 = 0;
    }
    else {
      iVar2 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
      if (iVar2 != 0) goto LAB_00130784;
    }
  }
  else {
LAB_00130784:
    Imf_3_4::MultiPartInputFile::header((int)&local_80);
    puVar5 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    sVar8 = puVar5[1];
    if (sVar8 == inputtype->_M_string_length) {
      if (sVar8 == 0) goto LAB_0013088b;
      iVar2 = bcmp((void *)*puVar5,(inputtype->_M_dataplus)._M_p,sVar8);
      if (iVar2 == 0) goto LAB_0013090a;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(inputtype->_M_dataplus)._M_p,
                        inputtype->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," but got ",9);
    Imf_3_4::MultiPartInputFile::header((int)&local_80);
    puVar5 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)*puVar5,puVar5[1]);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," from multipart when input type was ",0x24);
    sVar8 = *(size_t *)(filename + 8);
    if (sVar8 == DAT_001eafb0) {
      if (sVar8 != 0) {
        pvVar7 = *(void **)filename;
        iVar2 = bcmp(pvVar7,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
        if (iVar2 != 0) goto LAB_00130893;
      }
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"unset","");
    }
    else {
      pvVar7 = *(void **)filename;
LAB_00130893:
      local_a0 = local_90;
      std::__cxx11::string::_M_construct<char*>((string *)&local_a0,pvVar7,sVar8 + (long)pvVar7);
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_a0,local_98);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    sVar8 = inputtype->_M_string_length;
  }
LAB_0013090a:
  if (sVar8 == DAT_001eafb0) {
    if (sVar8 != 0) {
      iVar2 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
      if (iVar2 != 0) goto LAB_0013092e;
    }
  }
  else {
LAB_0013092e:
    Imf_3_4::MultiPartInputFile::header((int)&local_80);
    puVar5 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
    sVar8 = puVar5[1];
    if (sVar8 != inputtype->_M_string_length) {
LAB_00130bf8:
      __assert_fail("outputtype == NOTYPEATTR || file.header (0).type () == outputtype",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x148,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_4::InputFile, OUT = Imf_3_4::OutputFile]"
                   );
    }
    if (sVar8 != 0) {
      iVar2 = bcmp((void *)*puVar5,(inputtype->_M_dataplus)._M_p,sVar8);
      if (iVar2 != 0) goto LAB_00130bf8;
    }
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&local_80,"/var/tmp/badfile.exr",iVar2);
  sVar8 = inputtype->_M_string_length;
  if (sVar8 == DAT_001eafb0) {
    if (sVar8 != 0) {
      iVar2 = bcmp((inputtype->_M_dataplus)._M_p,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
      if (iVar2 != 0) goto LAB_001309cb;
    }
    Imf_3_4::InputFile::header();
    cVar1 = Imf_3_4::Header::hasType();
    if (cVar1 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," type attribute got inserted when it shouldn\'t have been\n"
                 ,0x39);
    }
    Imf_3_4::InputFile::header();
    cVar1 = Imf_3_4::Header::hasType();
    if (cVar1 != '\0') {
      __assert_fail("!file.header ().hasType ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testBadTypeAttributes.cpp"
                    ,0x155,
                    "void (anonymous namespace)::check(const char *, const string &, const string &, bool) [IN = Imf_3_4::InputFile, OUT = Imf_3_4::OutputFile]"
                   );
    }
    goto LAB_00130bb3;
  }
LAB_001309cb:
  Imf_3_4::InputFile::header();
  puVar5 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  sVar8 = puVar5[1];
  if (sVar8 == inputtype->_M_string_length) {
    if (sVar8 == 0) goto LAB_00130bb3;
    iVar2 = bcmp((void *)*puVar5,(inputtype->_M_dataplus)._M_p,sVar8);
    if (iVar2 == 0) goto LAB_00130bb3;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error: expected type in header to be ",0x25);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(inputtype->_M_dataplus)._M_p,
                      inputtype->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," but got ",9);
  Imf_3_4::InputFile::header();
  puVar5 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)*puVar5,puVar5[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," when input type was ",0x15);
  sVar8 = *(size_t *)(filename + 8);
  if (sVar8 == DAT_001eafb0) {
    if (sVar8 != 0) {
      pvVar7 = *(void **)filename;
      iVar2 = bcmp(pvVar7,_ZGRN12_GLOBAL__N_110NOTYPEATTRB5cxx11E_,sVar8);
      if (iVar2 != 0) goto LAB_00130b40;
    }
    local_a0 = local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"unset","");
  }
  else {
    pvVar7 = *(void **)filename;
LAB_00130b40:
    local_a0 = local_90;
    std::__cxx11::string::_M_construct<char*>((string *)&local_a0,pvVar7,sVar8 + (long)pvVar7);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_a0,local_98);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
LAB_00130bb3:
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  remove("/var/tmp/badfile.exr");
  Imf_3_4::Header::~Header(local_60);
  return;
}

Assistant:

void
check (
    const char*   filename,
    const string& inputtype,
    const string& outputtype,
    bool          add_tiledesc)
{
    Header f;
    f.channels ().insert ("Dummy", Channel ());

    if (inputtype != NOTYPEATTR) { f.setType (inputtype); }
    f.compression () = ZIPS_COMPRESSION;
    if (add_tiledesc) { f.setTileDescription (TileDescription ()); }

    remove (filename);
    {
        OUT file (filename, f);
    }

    {
        MultiPartInputFile file (filename);

        if (outputtype != NOTYPEATTR && file.header (0).type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header (0).type ()
                 << " from multipart when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }

        assert (
            outputtype == NOTYPEATTR || file.header (0).type () == outputtype);
    }

    {
        IN file (filename);
        if (outputtype == NOTYPEATTR)
        {
            if (file.header ().hasType ())
            {
                cerr
                    << " type attribute got inserted when it shouldn't have been\n";
            }

            assert (!file.header ().hasType ());
        }
        else if (file.header ().type () != outputtype)
        {
            cerr << "Error: expected type in header to be " << outputtype
                 << " but got " << file.header ().type ()
                 << " when input type was "
                 << (inputtype == NOTYPEATTR ? "unset" : inputtype)
                 << std::endl;
        }
    }
    remove (filename);
}